

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

optional<int> __thiscall ear::Layout::indexForName(Layout *this,string *name)

{
  bool bVar1;
  type tVar2;
  long lVar3;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  __it;
  long lVar4;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  __it_00;
  string *local_40;
  Channel *local_38;
  
  __it_00._M_current =
       (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)local_38 - (long)__it_00._M_current;
  lVar3 = (lVar4 >> 4) * -0x71c71c71c71c71c7 >> 2;
  local_40 = name;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar1) goto LAB_00145d5e;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar1) goto LAB_00145d5e;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar1) goto LAB_00145d5e;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar1) goto LAB_00145d5e;
      __it_00._M_current = __it_00._M_current + 4;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -0x240;
    } while (1 < lVar3);
  }
  lVar3 = (lVar4 >> 4) * -0x71c71c71c71c71c7;
  if (lVar3 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar3 != 2) {
      __it._M_current = local_38;
      if ((lVar3 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
                  operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                              *)&local_40,__it_00), __it._M_current = __it_00._M_current, bVar1))
      goto LAB_00145d5e;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                      ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it);
    if (bVar1) goto LAB_00145d5e;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                    ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0> *
                     )&local_40,__it_00);
  __it._M_current = local_38;
  if (bVar1) {
    __it._M_current = __it_00._M_current;
  }
LAB_00145d5e:
  if (__it._M_current ==
      (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    tVar2.m_initialized = false;
    tVar2._1_3_ = 0;
    tVar2.m_storage = 0;
  }
  else {
    tVar2 = (type)(((ulong)((long)__it._M_current -
                           (long)(this->_channels).
                                 super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 4) *
                   0x38e38e3900000000 + 1);
  }
  return (optional<int>)tVar2;
}

Assistant:

boost::optional<int> Layout::indexForName(const std::string& name) const {
    auto it = std::find_if(
        _channels.begin(), _channels.end(),
        [&name](const Channel c) -> bool { return c.name() == name; });
    if (it != _channels.end()) {
      return static_cast<int>(std::distance(_channels.begin(), it));
    } else {
      return boost::none;
    }
  }